

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_3::StringToBool
          (anon_unknown_3 *this,string *value,bool *result)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  string upper_value;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,this,this + (long)&value->_M_dataplus);
  if (local_30 != 0) {
    lVar3 = 0;
    do {
      if ((byte)(local_38[lVar3] + 0x9f) < 0x1a) {
        local_38[lVar3] = local_38[lVar3] + -0x20;
      }
      lVar3 = lVar3 + 1;
    } while (local_30 != lVar3);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar2 == 0) {
    bVar1 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar2 != 0) {
      bVar1 = false;
      goto LAB_00269ea7;
    }
    bVar1 = true;
  }
  *result = bVar1;
  bVar1 = true;
LAB_00269ea7:
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return bVar1;
}

Assistant:

bool StringToBool(const std::string& value, bool* result) {
  std::string upper_value(value);
  UpperString(&upper_value);
  if (upper_value == "NO") {
    *result = false;
    return true;
  }
  if (upper_value == "YES") {
    *result = true;
    return true;
  }

  return false;
}